

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode * extraBddSpaceCanonVars(DdManager *dd,DdNode *bF)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *bRes0;
  DdNode *bRes_1;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bFR;
  DdNode *bRes;
  DdNode *bF_local;
  DdManager *dd_local;
  
  pDVar1 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  if (pDVar1->index == 0x7fffffff) {
    return bF;
  }
  pDVar2 = cuddCacheLookup1(dd,extraBddSpaceCanonVars,bF);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  if (pDVar1 == bF) {
    bF1 = (pDVar1->type).kids.E;
    bRes_1 = (pDVar1->type).kids.T;
  }
  else {
    bF1 = (DdNode *)((ulong)(pDVar1->type).kids.E ^ 1);
    bRes_1 = (DdNode *)((ulong)(pDVar1->type).kids.T ^ 1);
  }
  if (bF1 == (DdNode *)((ulong)dd->one ^ 1)) {
    bRes0 = extraBddSpaceCanonVars(dd,bRes_1);
    if (bRes0 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
  }
  else if (bRes_1 == (DdNode *)((ulong)dd->one ^ 1)) {
    bRes0 = extraBddSpaceCanonVars(dd,bF1);
    if (bRes0 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
  }
  else {
    pDVar2 = extraBddSpaceCanonVars(dd,bF1);
    if (pDVar2 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    bRes0 = cuddUniqueInter(dd,pDVar1->index,pDVar2,(DdNode *)((ulong)dd->one ^ 1));
    if (bRes0 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar2);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + -1;
  }
  cuddCacheInsert1(dd,extraBddSpaceCanonVars,bF,bRes0);
  return bRes0;
}

Assistant:

DdNode * extraBddSpaceCanonVars( DdManager * dd, DdNode * bF )
{
	DdNode * bRes, * bFR;
	statLine( dd );

	bFR = Cudd_Regular(bF);
	if ( cuddIsConstant(bFR) )
		return bF;

    if ( (bRes = cuddCacheLookup1(dd, extraBddSpaceCanonVars, bF)) )
    	return bRes;
	else
	{
		DdNode * bF0,  * bF1;
		DdNode * bRes, * bRes0; 

		if ( bFR != bF ) // bF is complemented 
		{
			bF0 = Cudd_Not( cuddE(bFR) );
			bF1 = Cudd_Not( cuddT(bFR) );
		}
		else
		{
			bF0 = cuddE(bFR);
			bF1 = cuddT(bFR);
		}

		if ( bF0 == b0 )
		{
			bRes = extraBddSpaceCanonVars( dd, bF1 );
			if ( bRes == NULL )
				return NULL;
		}
		else if ( bF1 == b0 )
		{
			bRes = extraBddSpaceCanonVars( dd, bF0 );
			if ( bRes == NULL )
				return NULL;
		}
		else
		{
			bRes0 = extraBddSpaceCanonVars( dd, bF0 );
			if ( bRes0 == NULL )
				return NULL;
			cuddRef( bRes0 );

			bRes = cuddUniqueInter( dd, bFR->index, bRes0, b0 );
			if ( bRes == NULL ) 
			{
				Cudd_RecursiveDeref( dd,bRes0 );
				return NULL;
			}
			cuddDeref( bRes0 );
		}

		cuddCacheInsert1( dd, extraBddSpaceCanonVars, bF, bRes );
		return bRes;
	}
}